

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall
dxil_spv::Converter::Impl::get_ssbo_offset_buffer_id
          (Impl *this,Id *buffer_id,VulkanBinding *buffer_binding,VulkanBinding *offset_binding,
          ResourceKind kind,uint alignment)

{
  undefined8 uVar1;
  Id IVar2;
  void *pvVar3;
  LoggingCallback p_Var4;
  bool bVar5;
  undefined1 local_207c [8];
  BindlessInfo bindless_info;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  bool use_offsets;
  bool is_buffer_type;
  uint alignment_local;
  ResourceKind kind_local;
  VulkanBinding *offset_binding_local;
  VulkanBinding *buffer_binding_local;
  Id *buffer_id_local;
  Impl *this_local;
  
  *buffer_id = 0;
  bVar5 = true;
  if ((kind != StructuredBuffer) && (bVar5 = true, kind != RawBuffer)) {
    bVar5 = kind == TypedBuffer;
  }
  if (!bVar5) {
    return true;
  }
  bVar5 = false;
  if (buffer_binding->descriptor_type == SSBO) {
    if ((kind != TypedBuffer) && ((alignment & (this->options).ssbo_alignment - 1) != 0)) {
      if (((buffer_binding->bindless).use_heap & 1U) == 0) {
        buffer._4088_8_ = get_thread_log_callback();
        if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: SSBO offset is only supported for bindless SSBOs.\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&cb_1,0x1000,"SSBO offset is only supported for bindless SSBOs.\n");
          uVar1 = buffer._4088_8_;
          pvVar3 = get_thread_log_callback_userdata();
          (*(code *)uVar1)(pvVar3,2,&cb_1);
        }
        return false;
      }
      if (((offset_binding->bindless).use_heap & 1U) != 0) {
        p_Var4 = get_thread_log_callback();
        if (p_Var4 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: SSBO offset buffer must be a bindless buffer.\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&bindless_info.desc_set,0x1000,
                   "SSBO offset buffer must be a bindless buffer.\n");
          pvVar3 = get_thread_log_callback_userdata();
          (*p_Var4)(pvVar3,Error,(char *)&bindless_info.desc_set);
        }
        return false;
      }
      bVar5 = true;
    }
  }
  else if ((((this->options).bindless_typed_buffer_offsets & 1U) != 0) &&
          (((buffer_binding->bindless).use_heap & 1U) != 0)) {
    bVar5 = true;
  }
  if (bVar5) {
    memset(local_207c,0,0x24);
    bindless_info.kind = Texture1D;
    bindless_info._9_3_ = 0;
    local_207c[0] = SRV;
    bindless_info.descriptor_type._0_1_ = SSBO;
    bindless_info._20_4_ = offset_binding->descriptor_set;
    bindless_info._24_4_ = offset_binding->binding;
    local_207c[1] = U32;
    bindless_info.type = 0xb;
    IVar2 = create_bindless_heap_variable(this,(BindlessInfo *)local_207c);
    *buffer_id = IVar2;
  }
  return true;
}

Assistant:

bool Converter::Impl::get_ssbo_offset_buffer_id(spv::Id &buffer_id,
                                                const VulkanBinding &buffer_binding,
                                                const VulkanBinding &offset_binding,
                                                DXIL::ResourceKind kind, unsigned alignment)
{
	buffer_id = 0;

	bool is_buffer_type = kind == DXIL::ResourceKind::StructuredBuffer ||
	                      kind == DXIL::ResourceKind::RawBuffer ||
	                      kind == DXIL::ResourceKind::TypedBuffer;
	if (!is_buffer_type)
		return true;

	bool use_offsets = false;

	// If we're emitting an SSBO where we expect small alignment, we'll need to carry forward an "offset".
	if (buffer_binding.descriptor_type == VulkanDescriptorType::SSBO)
	{
		if (kind != DXIL::ResourceKind::TypedBuffer && (alignment & (options.ssbo_alignment - 1)) != 0)
		{
			if (!buffer_binding.bindless.use_heap)
			{
				LOGE("SSBO offset is only supported for bindless SSBOs.\n");
				return false;
			}

			if (offset_binding.bindless.use_heap)
			{
				LOGE("SSBO offset buffer must be a bindless buffer.\n");
				return false;
			}

			use_offsets = true;
		}
	}
	else if (options.bindless_typed_buffer_offsets && buffer_binding.bindless.use_heap)
	{
		use_offsets = true;
	}

	if (use_offsets)
	{
		BindlessInfo bindless_info = {};
		bindless_info.descriptor_type = VulkanDescriptorType::SSBO;
		bindless_info.type = DXIL::ResourceType::SRV;
		bindless_info.offsets = true;
		bindless_info.desc_set = offset_binding.descriptor_set;
		bindless_info.binding = offset_binding.binding;
		bindless_info.component = DXIL::ComponentType::U32;
		bindless_info.kind = DXIL::ResourceKind::RawBuffer;
		buffer_id = create_bindless_heap_variable(bindless_info);
	}

	return true;
}